

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O3

string * __thiscall
rcg::getComponetOfPart_abi_cxx11_
          (string *__return_storage_ptr__,rcg *this,shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,
          Buffer *buffer,uint32_t ipart)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long *plVar4;
  long *plVar5;
  ulong uVar6;
  undefined8 uVar7;
  undefined8 *puVar8;
  char *__s;
  uint64_t uVar9;
  size_t sVar10;
  size_t sVar11;
  uint32_t part;
  char *pcVar12;
  ulong uVar13;
  NodeList_t list;
  node_vector local_a0 [16];
  ulong local_90;
  long *local_88;
  gcstring local_80 [80];
  
  part = (uint32_t)buffer;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  plVar4 = *(long **)this;
  GenICam_3_4::gcstring::gcstring(local_80,"ChunkComponentSelector");
  lVar3 = (**(code **)(*plVar4 + 0x38))(plVar4,local_80);
  if (lVar3 == 0) {
    plVar4 = (long *)0x0;
  }
  else {
    plVar4 = (long *)__dynamic_cast(lVar3,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IEnumeration::typeinfo,0xfffffffffffffffe);
  }
  GenICam_3_4::gcstring::~gcstring(local_80);
  plVar5 = *(long **)this;
  GenICam_3_4::gcstring::gcstring(local_80,"ChunkPartIndex");
  lVar3 = (**(code **)(*plVar5 + 0x38))(plVar5,local_80);
  if (lVar3 == 0) {
    plVar5 = (long *)0x0;
  }
  else {
    plVar5 = (long *)__dynamic_cast(lVar3,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
  }
  GenICam_3_4::gcstring::~gcstring(local_80);
  if (((((plVar4 != (long *)0x0) && (plVar5 != (long *)0x0)) &&
       (iVar2 = (*(code *)**(undefined8 **)((long)plVar4 + *(long *)(*plVar4 + -0x28)))
                          ((long)plVar4 + *(long *)(*plVar4 + -0x28)), iVar2 - 3U < 2)) &&
      ((iVar2 = (*(code *)**(undefined8 **)((long)plVar4 + *(long *)(*plVar4 + -0x28)))
                          ((long)plVar4 + *(long *)(*plVar4 + -0x28)), iVar2 == 4 || (iVar2 == 2))))
     && (iVar2 = (*(code *)**(undefined8 **)((long)plVar5 + *(long *)(*plVar5 + -0x28)))
                           ((long)plVar5 + *(long *)(*plVar5 + -0x28)), iVar2 - 3U < 2)) {
    GenApi_3_4::node_vector::node_vector(local_a0);
    local_88 = plVar5;
    (**(code **)(*plVar4 + 0x40))(plVar4,local_a0);
    local_90 = (ulong)buffer & 0xffffffff;
    uVar13 = 0;
    while ((uVar6 = GenApi_3_4::node_vector::size(), uVar13 < uVar6 &&
           (__return_storage_ptr__->_M_string_length == 0))) {
      plVar5 = (long *)GenApi_3_4::node_vector::operator[]((ulong)local_a0);
      if ((*plVar5 != 0) &&
         ((plVar5 = (long *)__dynamic_cast(*plVar5,&GenApi_3_4::INode::typeinfo,
                                           &GenApi_3_4::IEnumEntry::typeinfo,0xfffffffffffffffe),
          plVar5 != (long *)0x0 &&
          (iVar2 = (*(code *)**(undefined8 **)((long)plVar5 + *(long *)(*plVar5 + -0x28)))
                             ((long)plVar5 + *(long *)(*plVar5 + -0x28)), iVar2 - 3U < 2)))) {
        uVar7 = (**(code **)(*plVar5 + 0x38))(plVar5);
        (**(code **)(*plVar4 + 0x50))(plVar4,uVar7,1);
        uVar6 = (**(code **)(*local_88 + 0x48))(local_88,0,0);
        if (uVar6 == local_90) {
          puVar8 = (undefined8 *)GenApi_3_4::node_vector::operator[]((ulong)local_a0);
          plVar5 = (long *)__dynamic_cast(*puVar8,&GenApi_3_4::INode::typeinfo,
                                          &GenApi_3_4::IEnumEntry::typeinfo,0xfffffffffffffffe);
          (**(code **)(*plVar5 + 0x40))(local_80);
          __s = GenICam_3_4::gcstring::operator_cast_to_char_(local_80);
          pcVar12 = (char *)__return_storage_ptr__->_M_string_length;
          strlen(__s);
          std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar12,(ulong)__s);
          GenICam_3_4::gcstring::~gcstring(local_80);
        }
      }
      uVar13 = uVar13 + 1;
    }
    GenApi_3_4::node_vector::~node_vector(local_a0);
  }
  if (__return_storage_ptr__->_M_string_length != 0) {
    return __return_storage_ptr__;
  }
  bVar1 = Buffer::getImagePresent((Buffer *)nodemap,part);
  if (!bVar1) {
    return __return_storage_ptr__;
  }
  uVar9 = Buffer::getPixelFormat((Buffer *)nodemap,part);
  if ((long)uVar9 < 0x11000b8) {
    if (uVar9 != 0x1080001) {
      if (uVar9 != 0x10800c6) {
        return __return_storage_ptr__;
      }
      pcVar12 = "Confidence";
      goto LAB_0011d44c;
    }
  }
  else {
    if (uVar9 == 0x11000b8) {
      pcVar12 = "Disparity";
      goto LAB_0011d44c;
    }
    if (uVar9 != 0x20c005a) {
      if (uVar9 != 0x81080001) {
        return __return_storage_ptr__;
      }
      pcVar12 = "Error";
      goto LAB_0011d44c;
    }
  }
  sVar10 = Buffer::getWidth((Buffer *)nodemap,part);
  sVar11 = Buffer::getHeight((Buffer *)nodemap,part);
  pcVar12 = "Intensity";
  if (sVar10 < sVar11) {
    pcVar12 = "IntensityCombined";
  }
LAB_0011d44c:
  std::__cxx11::string::_M_replace
            ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
             (ulong)pcVar12);
  return __return_storage_ptr__;
}

Assistant:

std::string getComponetOfPart(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap,
                              const Buffer *buffer, uint32_t ipart)
{
  std::string component;

  try
  {
    // get chunk component selector and proprietary chunk part index parmeters

    GenApi::IEnumeration *sel=dynamic_cast<GenApi::IEnumeration *>(nodemap->_GetNode("ChunkComponentSelector"));
    GenApi::IInteger *part=dynamic_cast<GenApi::IInteger *>(nodemap->_GetNode("ChunkPartIndex"));

    if (sel != 0 && part != 0)
    {
      if (GenApi::IsReadable(sel) && GenApi::IsWritable(sel) && GenApi::IsReadable(part))
      {
        // go through all available enumerations

        GenApi::NodeList_t list;
        sel->GetEntries(list);

        for (size_t i=0; i<list.size() && component.size() == 0; i++)
        {
          GenApi::IEnumEntry *entry=dynamic_cast<GenApi::IEnumEntry *>(list[i]);

          if (entry != 0 && GenApi::IsReadable(entry))
          {
            sel->SetIntValue(entry->GetValue());

            int64_t val=part->GetValue();
            if (val == ipart)
            {
              component=dynamic_cast<GenApi::IEnumEntry *>(list[i])->GetSymbolic();
            }
          }
        }
      }
    }
  }
  catch (const std::exception &)
  { /* ignore errors */ }
  catch (const GENICAM_NAMESPACE::GenericException &)
  { /* ignore errors */ }

  // try guessing component name from pixel format

  if (component.size() == 0 && buffer->getImagePresent(ipart))
  {
    switch (buffer->getPixelFormat(ipart))
    {
      case Mono8:
      case YCbCr411_8:
        if (buffer->getWidth(ipart) >= buffer->getHeight(ipart))
        {
          component="Intensity";
        }
        else
        {
          component="IntensityCombined";
        }
        break;

      case Coord3D_C16:
        component="Disparity";
        break;

      case Confidence8:
        component="Confidence";
        break;

      case Error8:
        component="Error";
        break;

      default:
        break;
    }
  }

  return component;
}